

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
* __thiscall
soul::StructuralParser::parseGenericFunctionWildcardList
          (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           *__return_storage_ptr__,StructuralParser *this)

{
  bool bVar1;
  CompileMessage local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x275bb9);
    if (!bVar1) {
      Errors::expectedGenericWildcardName<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_68);
      CompileMessage::~CompileMessage(&local_68);
    }
    local_68.description._M_dataplus._M_p = (pointer)parseUnqualifiedName(this);
    std::
    vector<soul::pool_ref<soul::AST::UnqualifiedName>,std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>>>
    ::emplace_back<soul::pool_ref<soul::AST::UnqualifiedName>>
              ((vector<soul::pool_ref<soul::AST::UnqualifiedName>,std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>>>
                *)__return_storage_ptr__,(pool_ref<soul::AST::UnqualifiedName> *)&local_68);
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29bc11);
    if (bVar1) break;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d9e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<AST::UnqualifiedName>> parseGenericFunctionWildcardList()
    {
        std::vector<pool_ref<AST::UnqualifiedName>> wildcards;

        for (;;)
        {
            if (! matches (Token::identifier))
                throwError (Errors::expectedGenericWildcardName());

            auto& wildcard = parseUnqualifiedName();

            wildcards.push_back (wildcard);

            if (matchIf (Operator::greaterThan))
                break;

            expect (Operator::comma);
        }

        return wildcards;
    }